

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

void __thiscall
asio::io_context::executor_type::
post<asio::detail::work_dispatcher<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>>,std::allocator<void>>
          (executor_type *this,
          work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
          *f,allocator<void> *a)

{
  executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  *this_00;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_RDI;
  ptr p;
  alloc_type allocator;
  function_type tmp;
  allocator<void> *in_stack_ffffffffffffff78;
  recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
  *in_stack_ffffffffffffff80;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_stack_ffffffffffffff88;
  work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
  *in_stack_ffffffffffffff98;
  executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  *peVar1;
  scheduler *in_stack_ffffffffffffffb0;
  recycling_allocator<void> local_39 [57];
  
  detail::
  work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>
  ::work_dispatcher(in_RDI,in_stack_ffffffffffffff88);
  detail::get_recycling_allocator<std::allocator<void>_>::get(in_stack_ffffffffffffff78);
  detail::
  recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
  ::recycling_allocator<void>
            ((recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
              *)&stack0xffffffffffffff98,local_39);
  this_00 = detail::
            recycling_allocator<asio::detail::executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>_>
            ::allocate(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  peVar1 = this_00;
  detail::
  executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  ::executor_op(this_00,in_stack_ffffffffffffff98,(recycling_allocator<void> *)in_RDI);
  detail::scheduler::post_immediate_completion
            (in_stack_ffffffffffffffb0,&this_00->super_scheduler_operation,
             SUB81((ulong)peVar1 >> 0x38,0));
  detail::
  executor_op<asio::detail::work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)0x21662f);
  detail::
  work_dispatcher<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>_>
  ::~work_dispatcher((work_dispatcher<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>_>
                      *)0x216639);
  return;
}

Assistant:

void io_context::executor_type::post(
    ASIO_MOVE_ARG(Function) f, const Allocator& a) const
{
  // Make a local, non-const copy of the function.
  typedef typename decay<Function>::type function_type;
  function_type tmp(ASIO_MOVE_CAST(Function)(f));

  // Construct an allocator to be used for the operation.
  typedef typename detail::get_recycling_allocator<Allocator>::type alloc_type;
  alloc_type allocator(detail::get_recycling_allocator<Allocator>::get(a));

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, alloc_type, detail::operation> op;
  typename op::ptr p = { allocator, 0, 0 };
  p.v = p.a.allocate(1);
  p.p = new (p.v) op(tmp, allocator);

  ASIO_HANDLER_CREATION((this->context(), *p.p,
        "io_context", &this->context(), 0, "post"));

  io_context_.impl_.post_immediate_completion(p.p, false);
  p.v = p.p = 0;
}